

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::handle_ext_resp_err(raft_server *this,rpc_exception *err)

{
  int iVar1;
  size_type sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  element_type *peVar4;
  bool bVar5;
  int iVar6;
  undefined8 uVar7;
  iterator iVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  msg_type t_msg;
  int iVar9;
  int32 peer_id;
  executor exec;
  undefined1 local_d9;
  element_type *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  undefined1 local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  _Head_base<0UL,_nuraft::raft_server_*,_false> local_98;
  key_type local_8c;
  ptr<peer> local_88;
  ptr<peer> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  _Any_data local_50;
  code *local_40;
  
  sVar2 = *(size_type *)(err + 8);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(err + 0x10);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
    if (3 < iVar6) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar7 = (**(code **)(*(long *)err + 0x10))(err);
      msg_if_given_abi_cxx11_
                ((string *)local_c8,"receive an rpc error response from peer server, %s %d",uVar7,
                 (ulong)*(uint *)(sVar2 + 0x10));
      (**(code **)(*(long *)peVar3 + 0x40))
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_ext_resp_err",0x5b5,local_c8);
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8);
      }
    }
  }
  t_msg = *(msg_type *)(sVar2 + 0x10);
  if (t_msg == install_snapshot_request) {
    peVar4 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar4 != (element_type *)0x0) &&
       (((peVar4->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->id_ == *(int *)(sVar2 + 0x18))) {
      local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
      bVar5 = check_snapshot_timeout(this,&local_78);
      if (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (!bVar5) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar3 != (element_type *)0x0) {
          iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
          if (2 < iVar6) {
            peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_c8,
                       "sending snapshot to joining server %d failed, retry with temp heartbeat",
                       (ulong)(uint)((((this->srv_to_join_).
                                       super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->config_).
                                     super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->id_);
            (**(code **)(*(long *)peVar3 + 0x40))
                      (peVar3,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"handle_ext_resp_err",0x5bd,local_c8);
            if (local_c8 != (undefined1  [8])&local_b8) {
              operator_delete((void *)local_c8);
            }
          }
        }
        LOCK();
        (this->srv_to_join_snp_retry_required_)._M_base._M_i = true;
        UNLOCK();
        enable_hb_for_peer(this,(this->srv_to_join_).
                                super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
      }
    }
    t_msg = *(msg_type *)(sVar2 + 0x10);
  }
  if ((t_msg == sync_log_request) || (t_msg == join_cluster_request)) {
    _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_8c = *(key_type *)(sVar2 + 0x18);
    local_d8 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    __r = &(this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount;
LAB_00125771:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_d0,__r);
  }
  else {
    if (t_msg != leave_cluster_request) goto LAB_001259c8;
    local_d8 = (element_type *)0x0;
    _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_8c = *(key_type *)(sVar2 + 0x18);
    iVar8 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->peers_)._M_h,&local_8c);
    if (iVar8.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      local_d8 = *(element_type **)
                  ((long)iVar8.
                         super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                         ._M_cur + 0x10);
      __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)iVar8.
                   super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                   ._M_cur + 0x18);
      goto LAB_00125771;
    }
  }
  if (local_d8 != (element_type *)0x0) {
    iVar6 = (local_d8->current_hb_interval_).super___atomic_base<int>._M_i;
    context::get_params((context *)local_c8);
    iVar1 = *(int *)((long)local_c8 + 8);
    iVar9 = *(int *)((long)local_c8 + 4) - iVar1 / 2;
    if (iVar9 < iVar1) {
      iVar9 = iVar1;
    }
    if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
    }
    if (iVar6 < iVar9) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 != (element_type *)0x0) {
        iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
        if (4 < iVar6) {
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_((string *)local_c8,"retry the request");
          (**(code **)(*(long *)peVar3 + 0x40))
                    (peVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_ext_resp_err",0x5dd,local_c8);
          if (local_c8 != (undefined1  [8])&local_b8) {
            operator_delete((void *)local_c8);
          }
        }
      }
      iVar6 = (local_d8->current_hb_interval_).super___atomic_base<int>._M_i +
              local_d8->rpc_backoff_;
      if (local_d8->max_hb_interval_ <= iVar6) {
        iVar6 = local_d8->max_hb_interval_;
      }
      LOCK();
      (local_d8->current_hb_interval_).super___atomic_base<int>._M_i = iVar6;
      UNLOCK();
      local_c8 = (undefined1  [8])on_retryable_req_err;
      _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_a8 = local_d8;
      local_a0._M_pi = _Stack_d0._M_pi;
      if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_d0._M_pi)->_M_use_count = (_Stack_d0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_d0._M_pi)->_M_use_count = (_Stack_d0._M_pi)->_M_use_count + 1;
        }
      }
      local_b8._M_allocated_capacity = sVar2;
      local_b8._8_8_ = this_00;
      local_98._M_head_impl = this;
      std::function<void()>::
      function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::req_msg>))(std::shared_ptr<nuraft::peer>&,std::shared_ptr<nuraft::req_msg>&)>,void>
                ((function<void()> *)local_50._M_pod_data,
                 (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::req_msg>))(std::shared_ptr<nuraft::peer>_&,_std::shared_ptr<nuraft::req_msg>_&)>
                  *)local_c8);
      if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<nuraft::timer_task<void>,std::allocator<nuraft::timer_task<void>>,std::function<void()>&>
                (a_Stack_60,(timer_task<void> **)&local_68,
                 (allocator<nuraft::timer_task<void>_> *)&local_d9,(function<void_()> *)&local_50);
      local_c8 = (undefined1  [8])local_68;
      _Stack_c0._M_pi = a_Stack_60[0]._M_pi;
      schedule_task(this,(ptr<delayed_task> *)local_c8,
                    (local_d8->current_hb_interval_).super___atomic_base<int>._M_i);
      if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
      }
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
    }
    else {
      local_88.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
      local_88.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_d0._M_pi;
      if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_d0._M_pi)->_M_use_count = (_Stack_d0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_d0._M_pi)->_M_use_count = (_Stack_d0._M_pi)->_M_use_count + 1;
        }
      }
      handle_join_leave_rpc_err(this,t_msg,&local_88);
      if (local_88.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
  }
  if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
  }
LAB_001259c8:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void raft_server::handle_ext_resp_err(rpc_exception& err) {
    ptr<req_msg> req = err.req();
    p_in( "receive an rpc error response from peer server, %s %d",
          err.what(), req->get_type() );

    if ( req->get_type() == msg_type::install_snapshot_request ) {
        if (srv_to_join_ && srv_to_join_->get_id() == req->get_dst()) {
            bool timed_out = check_snapshot_timeout(srv_to_join_);
            if (!timed_out) {
                // Enable temp HB to retry snapshot.
                p_wn("sending snapshot to joining server %d failed, "
                     "retry with temp heartbeat", srv_to_join_->get_id());
                srv_to_join_snp_retry_required_ = true;
                enable_hb_for_peer(*srv_to_join_);
            }
        }
    }

    if ( req->get_type() != msg_type::sync_log_request     &&
         req->get_type() != msg_type::join_cluster_request &&
         req->get_type() != msg_type::leave_cluster_request ) {
        return;
    }

    ptr<peer> p;
    msg_type t_msg = req->get_type();
    int32 peer_id = req->get_dst();
    if (t_msg == msg_type::leave_cluster_request) {
        peer_itor pit = peers_.find(peer_id);
        if (pit != peers_.end()) {
            p = pit->second;
        }
    } else {
        p = srv_to_join_;
    }
    if (!p) return;

    if (p->get_current_hb_interval() >= ctx_->get_params()->max_hb_interval()) {
        handle_join_leave_rpc_err(t_msg, p);

    } else {
        // reuse the heartbeat interval value to indicate
        // when to stop retrying, as rpc backoff is the same.
        p_db("retry the request");
        p->slow_down_hb();
        timer_task<void>::executor exec =
            (timer_task<void>::executor)
            std::bind( &raft_server::on_retryable_req_err, this, p, req );
        ptr<delayed_task> task(cs_new<timer_task<void>>(exec));
        schedule_task(task, p->get_current_hb_interval());
    }
}